

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

void __thiscall TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,int64_t dim)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  TPZRegisterClassId *in_RDI;
  int64_t size;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  int64_t in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<long_double> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZSFMatrix<long_double>>(in_RDI,0x21);
  TPZMatrix<long_double>::TPZMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (int64_t)in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZSFMatrix_0242a420;
  uVar2 = (**(code **)(*(long *)in_RDI + 600))();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)(in_RDI + 0x20) = pvVar3;
  if (*(long *)(in_RDI + 0x20) == 0) {
    TPZMatrix<long_double>::Error(in_stack_000001b0,in_stack_000001a8);
  }
  (**(code **)(*(long *)in_RDI + 0x78))();
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar>( dim, dim )
{
    int64_t size = Size();
	fElem = new TVar[ size ] ;
	
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Zera a Matriz.
	Zero();
}